

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_php.cpp
# Opt level: O2

void __thiscall
flatbuffers::php::PhpGenerator::GenStructAccessor
          (PhpGenerator *this,StructDef *struct_def,FieldDef *field,string *code_ptr)

{
  BaseType BVar1;
  
  GenComment(&(field->super_Definition).doc_comment,code_ptr,(CommentConfig *)0x0,Indent_abi_cxx11_)
  ;
  BVar1 = (field->value).type.base_type;
  if (BVar1 - BASE_TYPE_UTYPE < 0xc) {
    if (struct_def->fixed == true) {
      GetScalarFieldOfStruct(field,code_ptr);
    }
    else {
      GetScalarFieldOfTable(this,field,code_ptr);
    }
  }
  else {
    switch(BVar1) {
    case BASE_TYPE_STRING:
      GetStringField(this,field,code_ptr);
      break;
    case BASE_TYPE_VECTOR:
      BVar1 = (field->value).type.element;
      if (BVar1 == BASE_TYPE_STRUCT) {
        GetMemberOfVectorOfStruct(this,struct_def,field,code_ptr);
      }
      else if (BVar1 == BASE_TYPE_UNION) {
        GetMemberOfVectorOfUnion(this,field,code_ptr);
      }
      else {
        GetMemberOfVectorOfNonStruct(this,field,code_ptr);
      }
      break;
    case BASE_TYPE_STRUCT:
      if (struct_def->fixed == true) {
        GetStructFieldOfStruct(this,field,code_ptr);
      }
      else {
        GetStructFieldOfTable(this,field,code_ptr);
      }
      break;
    case BASE_TYPE_UNION:
      GetUnionField(this,field,code_ptr);
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_php.cpp"
                    ,0x2c9,
                    "void flatbuffers::php::PhpGenerator::GenStructAccessor(const StructDef &, const FieldDef &, std::string *)"
                   );
    }
  }
  BVar1 = (field->value).type.base_type;
  if (((BVar1 == BASE_TYPE_VECTOR64) || (BVar1 == BASE_TYPE_VECTOR)) &&
     (GetVectorLen(field,code_ptr), (field->value).type.element == BASE_TYPE_UCHAR)) {
    GetUByte(field,code_ptr);
    return;
  }
  return;
}

Assistant:

void GenStructAccessor(const StructDef &struct_def, const FieldDef &field,
                         std::string *code_ptr) {
    GenComment(field.doc_comment, code_ptr, nullptr, Indent.c_str());

    if (IsScalar(field.value.type.base_type)) {
      if (struct_def.fixed) {
        GetScalarFieldOfStruct(field, code_ptr);
      } else {
        GetScalarFieldOfTable(field, code_ptr);
      }
    } else {
      switch (field.value.type.base_type) {
        case BASE_TYPE_STRUCT:
          if (struct_def.fixed) {
            GetStructFieldOfStruct(field, code_ptr);
          } else {
            GetStructFieldOfTable(field, code_ptr);
          }
          break;
        case BASE_TYPE_STRING: GetStringField(field, code_ptr); break;
        case BASE_TYPE_VECTOR: {
          auto vectortype = field.value.type.VectorType();
          if (vectortype.base_type == BASE_TYPE_UNION) {
            GetMemberOfVectorOfUnion(field, code_ptr);
          } else if (vectortype.base_type == BASE_TYPE_STRUCT) {
            GetMemberOfVectorOfStruct(struct_def, field, code_ptr);
          } else {
            GetMemberOfVectorOfNonStruct(field, code_ptr);
          }
          break;
        }
        case BASE_TYPE_UNION: GetUnionField(field, code_ptr); break;
        default: FLATBUFFERS_ASSERT(0);
      }
    }
    if (IsVector(field.value.type)) {
      GetVectorLen(field, code_ptr);
      if (field.value.type.element == BASE_TYPE_UCHAR) {
        GetUByte(field, code_ptr);
      }
    }
  }